

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O3

SelectionSet * __thiscall
OpenMD::SelectionSet::get
          (SelectionSet *__return_storage_ptr__,SelectionSet *this,
          vector<int,_std::allocator<int>_> *fromIndex,vector<int,_std::allocator<int>_> *toIndex)

{
  _Bvector_base<std::allocator<bool>_> *this_00;
  long lVar1;
  long lVar2;
  OpenMDBitSet local_58;
  
  SelectionSet(__return_storage_ptr__);
  lVar1 = 0;
  lVar2 = 0;
  do {
    OpenMDBitSet::get(&local_58,
                      (OpenMDBitSet *)
                      ((long)&(((this->bitsets_).
                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                              super__Bvector_base<std::allocator<bool>_> + lVar1),
                      (long)(fromIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar2],
                      (long)(toIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar2]);
    this_00 = (_Bvector_base<std::allocator<bool>_> *)
              ((long)&(((__return_storage_ptr__->bitsets_).
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_> + lVar1);
    std::_Bvector_base<std::allocator<bool>_>::_M_deallocate(this_00);
    (this_00->_M_impl).super__Bvector_impl_data._M_end_of_storage =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_end_of_storage;
    (this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    (this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    *(undefined4 *)
     &(this_00->_M_impl).super__Bvector_impl_data._M_finish.super__Bit_iterator_base.field_0xc =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_;
    (this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    (this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
    *(undefined4 *)
     &(this_00->_M_impl).super__Bvector_impl_data._M_start.super__Bit_iterator_base.field_0xc =
         local_58.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_;
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + 0x28;
  } while (lVar2 != 6);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionSet::get(std::vector<int> fromIndex,
                                 std::vector<int> toIndex) {
    SelectionSet result;

    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result.bitsets_[i] = bitsets_[i].get(fromIndex[i], toIndex[i]);

    return result;
  }